

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerformImplementation.hpp
# Opt level: O3

void InstructionSet::M68k::Primitive::
     rotate<(InstructionSet::M68k::Operation)90,unsigned_short,CPU::MC68000::ProcessorBase>
               (uint32_t source,unsigned_short *destination,Status *status,
               ProcessorBase *flow_controller)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  
  flow_controller->dynamic_instruction_length_ = (source & 0x3f) + 1;
  if ((source & 0x3f) == 0) {
    status->carry_flag = 0;
    uVar3 = (uint)*destination;
    uVar4 = (ulong)(uVar3 & 0x8000);
  }
  else {
    uVar2 = *destination;
    if ((source & 0xf) != 0) {
      bVar1 = (byte)source & 0xf;
      uVar2 = uVar2 >> bVar1 | uVar2 << 0x10 - bVar1;
      *destination = uVar2;
    }
    uVar3 = (uint)uVar2;
    uVar4 = (ulong)(uVar3 & 0x8000);
    status->carry_flag = uVar4;
  }
  status->zero_result = (ulong)uVar3;
  status->negative_flag = uVar4;
  status->overflow_flag = 0;
  return;
}

Assistant:

int shift_count(uint8_t source, FlowController &flow_controller) {
	const int count = source & 63;
	flow_controller.template did_shift<IntT>(count);
	return count;
}